

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManComputeOverlapOne(Gia_Man_t *p,int iObj)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  Gia_ManIncrementTravId(p);
  if (-1 < iObj) {
    pVVar1 = p->vMapping;
    lVar5 = 0;
    while (iVar4 = pVVar1->nSize, iObj < iVar4) {
      piVar2 = pVVar1->pArray;
      lVar6 = (long)piVar2[(uint)iObj];
      if ((lVar6 < 0) || (iVar4 <= piVar2[(uint)iObj])) break;
      if (piVar2[lVar6] <= lVar5) {
        iVar4 = Gia_ManComputeOverlapOne_rec(p,iObj);
        return iVar4;
      }
      lVar3 = lVar5 + 1;
      if (p->nTravIdsAlloc <= piVar2[lVar6 + lVar3]) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
      }
      lVar5 = lVar5 + 1;
      p->pTravIds[piVar2[lVar6 + lVar3]] = p->nTravIds;
      if (iObj < 0) break;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_ManComputeOverlapOne( Gia_Man_t * p, int iObj )
{
    int iFan, k;
    Gia_ManIncrementTravId(p);
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Gia_ObjSetTravIdCurrentId( p, iFan );
    return Gia_ManComputeOverlapOne_rec( p, iObj );
}